

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O3

int yang_extcomplex_node
              (lys_ext_instance_complex *ext,char *parent_name,char *node_name,lys_node *node,
              LY_STMT stmt)

{
  LY_STMT LVar1;
  lyext_substmt *in_RAX;
  void *pvVar2;
  LY_ECODE code;
  int iVar3;
  lyext_substmt *local_38;
  lyext_substmt *info;
  
  local_38 = in_RAX;
  pvVar2 = lys_ext_complex_get_substmt(stmt,ext,&local_38);
  if (pvVar2 == (void *)0x0) {
    code = LYE_INCHILDSTMT;
LAB_00151cf4:
    ly_vlog(code,LY_VLOG_NONE,(void *)0x0,node_name,parent_name);
    iVar3 = 1;
  }
  else {
    iVar3 = 0;
    if (node != (lys_node *)0x0 && local_38->cardinality < LY_STMT_CARD_SOME) {
      do {
        LVar1 = lys_snode2stmt(node->nodetype);
        if (LVar1 == stmt) {
          code = LYE_TOOMANY;
          goto LAB_00151cf4;
        }
        node = node->next;
        iVar3 = 0;
      } while (node != (lys_node *)0x0);
    }
  }
  return iVar3;
}

Assistant:

int
yang_extcomplex_node(struct lys_ext_instance_complex *ext, char *parent_name, char *node_name,
                     struct lys_node *node, LY_STMT stmt)
{
    struct lyext_substmt *info;
    struct lys_node **snode, *siter;

    snode = lys_ext_complex_get_substmt(stmt, ext, &info);
    if (!snode) {
        LOGVAL(LYE_INCHILDSTMT, LY_VLOG_NONE, NULL, node_name, parent_name);
        return EXIT_FAILURE;
    }
    if (info->cardinality < LY_STMT_CARD_SOME) {
        LY_TREE_FOR(node, siter) {
            if (stmt == lys_snode2stmt(siter->nodetype)) {
                LOGVAL(LYE_TOOMANY, LY_VLOG_NONE, NULL, node_name, parent_name);
                return EXIT_FAILURE;
            }
        }
    }

    return EXIT_SUCCESS;
}